

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O1

Node * cookmem::PtrAVLTree::balance(Node **stack,int16_t depth)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  short sVar4;
  Node *pNVar5;
  short sVar6;
  uint uVar7;
  int16_t iVar8;
  int16_t iVar9;
  short sVar10;
  
  while( true ) {
    while( true ) {
      depth = depth + -1;
      pNVar3 = stack[depth];
      pNVar2 = pNVar3->left;
      if (pNVar2 == (Node *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = pNVar2->height;
      }
      pNVar5 = pNVar3->right;
      if (pNVar5 == (Node *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = pNVar5->height;
      }
      sVar4 = 0;
      if ((short)(sVar6 - iVar9) < 2) break;
      if (pNVar2->left == (Node *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = pNVar2->left->height;
      }
      pNVar5 = pNVar2->right;
      if (pNVar5 == (Node *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = pNVar5->height;
      }
      if (sVar6 < iVar9) {
        pNVar1 = pNVar5->left;
        pNVar2->right = pNVar1;
        pNVar5->left = pNVar2;
        if (pNVar2->left == (Node *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = pNVar2->left->height;
        }
        if (pNVar1 == (Node *)0x0) {
          iVar9 = 0;
        }
        else {
          iVar9 = pNVar1->height;
        }
        if (iVar9 < sVar6) {
          iVar9 = sVar6;
        }
        sVar10 = iVar9 + 1;
        pNVar2->height = sVar10;
        pNVar1 = pNVar5->right;
        sVar6 = 0;
        if (pNVar1 == (Node *)0x0) {
          iVar9 = 0;
        }
        else {
          iVar9 = pNVar1->height;
        }
        if (pNVar2 == (Node *)0x0) {
          sVar10 = 0;
        }
        if (sVar10 <= iVar9) {
          sVar10 = iVar9;
        }
        pNVar5->height = sVar10 + 1;
        pNVar3->left = pNVar1;
        pNVar5->right = pNVar3;
        if (pNVar1 != (Node *)0x0) {
          sVar6 = pNVar1->height;
        }
        if (pNVar3->right == (Node *)0x0) {
          sVar10 = 0;
        }
        else {
          sVar10 = pNVar3->right->height;
        }
        if (sVar10 < sVar6) {
          sVar10 = sVar6;
        }
        pNVar3->height = sVar10 + 1;
        if (pNVar5->left == (Node *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = pNVar5->left->height;
        }
        sVar10 = sVar10 + 1;
        if (pNVar3 == (Node *)0x0) {
          sVar10 = sVar4;
        }
        if (sVar6 <= sVar10) {
          sVar6 = sVar10;
        }
        pNVar5->height = sVar6 + 1;
        pNVar2 = pNVar5;
      }
      else {
        pNVar3->left = pNVar5;
        pNVar2->right = pNVar3;
        if (pNVar5 == (Node *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = pNVar5->height;
        }
        if (pNVar3->right == (Node *)0x0) {
          sVar10 = 0;
        }
        else {
          sVar10 = pNVar3->right->height;
        }
        if (sVar10 < sVar6) {
          sVar10 = sVar6;
        }
        pNVar3->height = sVar10 + 1;
        if (pNVar2->left == (Node *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = pNVar2->left->height;
        }
        sVar10 = sVar10 + 1;
        if (pNVar3 == (Node *)0x0) {
          sVar10 = sVar4;
        }
        if (sVar6 <= sVar10) {
          sVar6 = sVar10;
        }
        pNVar2->height = sVar6 + 1;
      }
      if (depth == 0) {
        uVar7 = 1;
        goto LAB_00102f9b;
      }
      pNVar3 = stack[(long)depth + -1];
      if (pNVar2->size < pNVar3->size) {
        pNVar3->left = pNVar2;
      }
      else {
        pNVar3->right = pNVar2;
      }
    }
    if (-2 < (short)(sVar6 - iVar9)) break;
    if (pNVar5->right == (Node *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = pNVar5->right->height;
    }
    pNVar2 = pNVar5->left;
    if (pNVar2 == (Node *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = pNVar2->height;
    }
    if (sVar6 < iVar9) {
      pNVar1 = pNVar2->right;
      pNVar5->left = pNVar1;
      pNVar2->right = pNVar5;
      if (pNVar1 == (Node *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = pNVar1->height;
      }
      if (pNVar5->right == (Node *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = pNVar5->right->height;
      }
      if (iVar9 < sVar6) {
        iVar9 = sVar6;
      }
      pNVar5->height = iVar9 + 1;
      pNVar1 = pNVar2->left;
      sVar6 = 0;
      if (pNVar1 == (Node *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = pNVar1->height;
      }
      sVar10 = iVar9 + 1;
      if (pNVar5 == (Node *)0x0) {
        sVar10 = sVar6;
      }
      if (iVar8 <= sVar10) {
        iVar8 = sVar10;
      }
      pNVar2->height = iVar8 + 1;
      pNVar3->right = pNVar1;
      pNVar2->left = pNVar3;
      if (pNVar3->left != (Node *)0x0) {
        sVar6 = pNVar3->left->height;
      }
      if (pNVar1 == (Node *)0x0) {
        sVar10 = 0;
      }
      else {
        sVar10 = pNVar1->height;
      }
      if (sVar10 < sVar6) {
        sVar10 = sVar6;
      }
      pNVar3->height = sVar10 + 1;
      if (pNVar2->right == (Node *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = pNVar2->right->height;
      }
      sVar10 = sVar10 + 1;
      if (pNVar3 == (Node *)0x0) {
        sVar10 = sVar4;
      }
      if (sVar10 <= sVar6) {
        sVar10 = sVar6;
      }
      pNVar2->height = sVar10 + 1;
      pNVar5 = pNVar2;
    }
    else {
      pNVar3->right = pNVar2;
      pNVar5->left = pNVar3;
      if (pNVar3->left == (Node *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = pNVar3->left->height;
      }
      if (pNVar2 == (Node *)0x0) {
        sVar10 = 0;
      }
      else {
        sVar10 = pNVar2->height;
      }
      if (sVar10 < sVar6) {
        sVar10 = sVar6;
      }
      pNVar3->height = sVar10 + 1;
      if (pNVar5->right == (Node *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = pNVar5->right->height;
      }
      sVar10 = sVar10 + 1;
      if (pNVar3 == (Node *)0x0) {
        sVar10 = sVar4;
      }
      if (sVar10 <= sVar6) {
        sVar10 = sVar6;
      }
      pNVar5->height = sVar10 + 1;
    }
    if (depth == 0) {
      uVar7 = 1;
LAB_00102f9b:
      pNVar3 = (Node *)(*(code *)(&DAT_00104004 + *(int *)(&DAT_00104004 + (ulong)uVar7 * 4)))
                                 (stack,&DAT_00104004 + *(int *)(&DAT_00104004 + (ulong)uVar7 * 4));
      return pNVar3;
    }
    pNVar3 = stack[(long)depth + -1];
    if (pNVar5->size < pNVar3->size) {
      pNVar3->left = pNVar5;
    }
    else {
      pNVar3->right = pNVar5;
    }
  }
  if (pNVar2 == (Node *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = pNVar2->height;
  }
  if (pNVar5 == (Node *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = pNVar5->height;
  }
  if (sVar4 < sVar6) {
    sVar4 = sVar6;
  }
  sVar6 = pNVar3->height;
  pNVar3->height = sVar4 + 1;
  if (depth == 0) {
    uVar7 = 1;
  }
  else {
    uVar7 = (uint)(sVar6 == (short)(sVar4 + 1)) * 2;
  }
  goto LAB_00102f9b;
}

Assistant:

inline static Node*
    balance (Node** stack, std::int16_t depth)
    {
        for (;;)
        {
            --depth;
            Node* root = stack[depth];
            Node* left = root->left;
            Node* right = root->right;

            std::int16_t oldHeight = root->height;
            int16_t diff = getHeight (left) - getHeight (right);
            if (diff > 1)
            {
                if (getHeight (left->left) >= getHeight (left->right))
                {
                    root = rotateWithLeftChild (root);
                }
                else
                {
                    root = doubleWithLeftChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else if (diff < -1)
            {
                if (getHeight (right->right) >= getHeight (right->left))
                {
                    root = rotateWithRightChild (root);
                }
                else
                {
                    root = doubleWithRightChild (root);
                }
                // update the parent
                if (depth == 0)
                {
                    return root;
                }
                setParent (root, stack[depth - 1]);
                continue;
            }
            else
            {
                updateHeight (root);
            }

            if (depth == 0)
            {
                return root;
            }

            if (oldHeight == root->height)
                break;
        }
        return nullptr;
    }